

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O1

REF_STATUS ref_shard_mark_n(REF_SHARD ref_shard,REF_INT *face_marks,REF_INT *hex_marks)

{
  REF_FACE pRVar1;
  REF_INT *pRVar2;
  REF_STATUS RVar3;
  uint uVar4;
  long lVar5;
  REF_CELL ref_cell;
  int cell;
  REF_BOOL marked13;
  REF_BOOL marked02;
  REF_BOOL marked25;
  REF_BOOL marked16;
  REF_BOOL marked05;
  REF_BOOL marked14;
  REF_INT hex_nodes [27];
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  REF_INT local_a8;
  REF_INT local_a4;
  REF_INT local_a0;
  REF_INT local_9c;
  REF_INT local_98;
  REF_INT local_94;
  REF_INT local_90;
  
  *face_marks = 0;
  pRVar1 = ref_shard->face;
  if (0 < pRVar1->n) {
    pRVar2 = ref_shard->mark;
    lVar5 = 0;
    do {
      if (pRVar2[lVar5] != 0) {
        *face_marks = *face_marks + 1;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < pRVar1->n);
  }
  *hex_marks = 0;
  ref_cell = ref_shard->grid->cell[0xb];
  if (0 < ref_cell->max) {
    cell = 0;
    do {
      RVar3 = ref_cell_nodes(ref_cell,cell,&local_a8);
      if (RVar3 == 0) {
        uVar4 = ref_shard_marked(ref_shard,local_a4,local_98,&local_ac);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0x8c,"ref_shard_mark_n",(ulong)uVar4,"1-4");
          return uVar4;
        }
        uVar4 = ref_shard_marked(ref_shard,local_a8,local_94,&local_b0);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0x8e,"ref_shard_mark_n",(ulong)uVar4,"0-5");
          return uVar4;
        }
        if (local_b0 != 0 || local_ac != 0) {
          *hex_marks = *hex_marks + 1;
        }
        uVar4 = ref_shard_marked(ref_shard,local_a4,local_90,&local_b4);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0x93,"ref_shard_mark_n",(ulong)uVar4,"1-6");
          return uVar4;
        }
        uVar4 = ref_shard_marked(ref_shard,local_a0,local_94,&local_b8);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0x95,"ref_shard_mark_n",(ulong)uVar4,"2-5");
          return uVar4;
        }
        if (local_b8 != 0 || local_b4 != 0) {
          *hex_marks = *hex_marks + 1;
        }
        uVar4 = ref_shard_marked(ref_shard,local_a8,local_a0,&local_bc);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0x9a,"ref_shard_mark_n",(ulong)uVar4,"0-2");
          return uVar4;
        }
        uVar4 = ref_shard_marked(ref_shard,local_a4,local_9c,&local_c0);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0x9c,"ref_shard_mark_n",(ulong)uVar4,"1-3");
          return uVar4;
        }
        if (local_c0 != 0 || local_bc != 0) {
          *hex_marks = *hex_marks + 1;
        }
      }
      cell = cell + 1;
      ref_cell = ref_shard->grid->cell[0xb];
    } while (cell < ref_cell->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_shard_mark_n(REF_SHARD ref_shard, REF_INT *face_marks,
                                    REF_INT *hex_marks) {
  REF_INT face;
  REF_INT cell, hex_nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL marked14, marked05;
  REF_BOOL marked16, marked25;
  REF_BOOL marked02, marked13;

  (*face_marks) = 0;

  for (face = 0; face < ref_face_n(ref_shard_face(ref_shard)); face++)
    if (0 != ref_shard_mark(ref_shard, face)) (*face_marks)++;

  (*hex_marks) = 0;
  each_ref_cell_valid_cell_with_nodes(ref_grid_hex(ref_shard_grid(ref_shard)),
                                      cell, hex_nodes) {
    RSS(ref_shard_marked(ref_shard, hex_nodes[1], hex_nodes[4], &marked14),
        "1-4");
    RSS(ref_shard_marked(ref_shard, hex_nodes[0], hex_nodes[5], &marked05),
        "0-5");

    if (marked14 || marked05) (*hex_marks)++;

    RSS(ref_shard_marked(ref_shard, hex_nodes[1], hex_nodes[6], &marked16),
        "1-6");
    RSS(ref_shard_marked(ref_shard, hex_nodes[2], hex_nodes[5], &marked25),
        "2-5");

    if (marked16 || marked25) (*hex_marks)++;

    RSS(ref_shard_marked(ref_shard, hex_nodes[0], hex_nodes[2], &marked02),
        "0-2");
    RSS(ref_shard_marked(ref_shard, hex_nodes[1], hex_nodes[3], &marked13),
        "1-3");

    if (marked02 || marked13) (*hex_marks)++;
  }

  return REF_SUCCESS;
}